

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

void Abc_DfsLevelizedTfo_rec(Abc_Obj_t *pNode,Vec_Vec_t *vLevels)

{
  int iVar1;
  Abc_Obj_t *pNode_00;
  int local_24;
  int i;
  Abc_Obj_t *pFanout;
  Vec_Vec_t *vLevels_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pNode);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pNode);
    iVar1 = Abc_ObjIsCo(pNode);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsNode(pNode);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsNode(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                      ,0x50e,"void Abc_DfsLevelizedTfo_rec(Abc_Obj_t *, Vec_Vec_t *)");
      }
      Vec_VecPush(vLevels,*(uint *)&pNode->field_0x14 >> 0xc,pNode);
      for (local_24 = 0; iVar1 = Abc_ObjFanoutNum(pNode), local_24 < iVar1; local_24 = local_24 + 1)
      {
        pNode_00 = Abc_ObjFanout(pNode,local_24);
        Abc_DfsLevelizedTfo_rec(pNode_00,vLevels);
      }
    }
  }
  return;
}

Assistant:

void Abc_DfsLevelizedTfo_rec( Abc_Obj_t * pNode, Vec_Vec_t * vLevels )
{
    Abc_Obj_t * pFanout;
    int i;
    // if this node is already visited, skip
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    // mark the node as visited
    Abc_NodeSetTravIdCurrent( pNode );
    // skip the terminals
    if ( Abc_ObjIsCo(pNode) )
        return;
    assert( Abc_ObjIsNode(pNode) );
    // add the node to the structure
    Vec_VecPush( vLevels, pNode->Level, pNode );
    // visit the TFO
    Abc_ObjForEachFanout( pNode, pFanout, i )
        Abc_DfsLevelizedTfo_rec( pFanout, vLevels );
}